

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall FixedElement::~FixedElement(FixedElement *this)

{
  FixedElement *this_local;
  
  this->_vptr_FixedElement = (_func_int **)&PTR___cxa_pure_virtual_002aa2a0;
  std::__cxx11::string::~string((string *)&this->gene_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map(&this->interactions_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::enable_shared_from_this<FixedElement>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<FixedElement>);
  return;
}

Assistant:

FixedElement::~FixedElement(){}